

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.hpp
# Opt level: O0

void hex2bin(char *in,int length,char *out)

{
  char cVar1;
  byte bVar2;
  char *pcVar3;
  byte *in_RDX;
  int in_ESI;
  char *in_RDI;
  char nibble2;
  char nibble1;
  int i;
  int local_1c;
  byte *local_18;
  char *local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  for (local_1c = 0; local_1c < in_ESI; local_1c = local_1c + 2) {
    pcVar3 = local_8 + 1;
    cVar1 = parseNibble(*local_8);
    local_8 = local_8 + 2;
    bVar2 = parseNibble(*pcVar3);
    *local_18 = cVar1 << 4 | bVar2;
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void hex2bin(const char *in, int length, char *out) {
	for (int i = 0; i < length; i += 2) {
		char nibble1 = parseNibble(*in++);
		char nibble2 = parseNibble(*in++);
		*out++ = nibble1 << 4 | nibble2;
	}
}